

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkMerge.c
# Opt level: O2

Nwk_Vrt_t * Nwk_ManGraphListFindMin(Nwk_Grf_t *p,int List)

{
  int *piVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  Nwk_Vrt_t *pNVar5;
  Nwk_Vrt_t *pNVar6;
  Nwk_Vrt_t *pNVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  bool bVar11;
  
  if (List == 0) {
    pNVar6 = (Nwk_Vrt_t *)0x0;
  }
  else {
    pNVar6 = p->pVerts[List];
  }
  iVar8 = 1000000;
  iVar9 = 10000;
  pNVar5 = (Nwk_Vrt_t *)0x0;
  while( true ) {
    if (pNVar6 == (Nwk_Vrt_t *)0x0) {
      return pNVar5;
    }
    uVar3 = pNVar6->nEdges;
    if (pNVar6->nEdges < 1) {
      uVar3 = 0;
    }
    for (uVar10 = 0; uVar3 != uVar10; uVar10 = uVar10 + 1) {
      iVar2 = p->pVerts[(&pNVar6[1].Id)[uVar10]]->nEdges;
      iVar4 = iVar8;
      if (iVar2 <= iVar8) {
        iVar4 = iVar2;
      }
      pNVar7 = pNVar5;
      if (iVar2 < iVar8) {
        pNVar7 = pNVar6;
      }
      bVar11 = pNVar5 == (Nwk_Vrt_t *)0x0;
      iVar8 = iVar4;
      pNVar5 = pNVar7;
      if (bVar11) {
        iVar8 = iVar2;
        pNVar5 = pNVar6;
      }
    }
    iVar9 = iVar9 + -1;
    if (iVar9 == 0) break;
    piVar1 = &pNVar6->iNext;
    pNVar6 = (Nwk_Vrt_t *)0x0;
    if ((long)*piVar1 != 0) {
      pNVar6 = p->pVerts[*piVar1];
    }
  }
  return pNVar5;
}

Assistant:

Nwk_Vrt_t * Nwk_ManGraphListFindMin( Nwk_Grf_t * p, int List )
{
    Nwk_Vrt_t * pThis, * pMinCost = NULL;
    int k, Counter = 10000, BestCost = 1000000;
    Nwk_ListForEachVertex( p, List, pThis )
    {
        for ( k = 0; k < pThis->nEdges; k++ )
        {
            if ( pMinCost == NULL || BestCost > p->pVerts[pThis->pEdges[k]]->nEdges )
            {
                BestCost = p->pVerts[pThis->pEdges[k]]->nEdges;
                pMinCost = pThis;
            }
        }
        if ( --Counter == 0 )
            break;
    }
    return pMinCost;
}